

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  undefined1 uVar4;
  ulong uVar5;
  byte *end_00;
  byte *pbVar6;
  byte bVar7;
  
  if (ptr == end) {
    return -4;
  }
  uVar5 = (long)end - (long)ptr;
  end_00 = (byte *)(ptr + (uVar5 & 0xfffffffffffffffe));
  if ((uVar5 & 0xfffffffffffffffe) == 0) {
    end_00 = (byte *)end;
  }
  if ((uVar5 & 1) == 0) {
    end_00 = (byte *)end;
  }
  if (uVar5 == 1) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    uVar4 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      }
      else {
LAB_0015d22f:
        uVar4 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar4 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto LAB_0015d22f;
    uVar4 = 0;
  }
  iVar3 = 0x12;
  switch(uVar4) {
  case 2:
    pbVar6 = (byte *)(ptr + 2);
    if (pbVar6 == end_00) {
      return -1;
    }
    bVar1 = *pbVar6;
    if (bVar1 < 0xdc) {
      bVar7 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar7 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        }
        else {
LAB_0015d830:
          bVar7 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar7 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto LAB_0015d830;
      bVar7 = 0;
    }
    switch(bVar7) {
    case 0xf:
      iVar3 = big2_scanPi(enc,ptr + 4,(char *)end_00,nextTokPtr);
      return iVar3;
    case 0x10:
      iVar3 = big2_scanDecl(enc,ptr + 4,(char *)end_00,nextTokPtr);
      return iVar3;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      goto switchD_0015d85a_caseD_11;
    case 0x16:
    case 0x18:
switchD_0015d85a_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar7 - 5 < 3) || (bVar7 == 0x1d)) goto switchD_0015d85a_caseD_16;
switchD_0015d85a_caseD_11:
      *nextTokPtr = (char *)pbVar6;
    }
    goto LAB_0015d499;
  default:
    goto switchD_0015d254_caseD_3;
  case 4:
    pbVar6 = (byte *)(ptr + 2);
    if (pbVar6 == end_00) {
      iVar3 = -0x1a;
    }
    else {
      if ((*pbVar6 == 0) && (ptr[3] == ']')) {
        if ((byte *)(ptr + 4) == end_00) {
          return -1;
        }
        if ((ptr[4] == 0) && (ptr[5] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = (char *)pbVar6;
      iVar3 = 0x1a;
    }
    break;
  case 5:
switchD_0015d254_caseD_5:
    if ((long)end_00 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_0015d254_caseD_3;
  case 6:
switchD_0015d254_caseD_6:
    if ((long)end_00 - (long)ptr < 3) {
      return -2;
    }
    goto switchD_0015d254_caseD_3;
  case 7:
switchD_0015d254_caseD_7:
    if ((long)end_00 - (long)ptr < 4) {
      return -2;
    }
    goto switchD_0015d254_caseD_3;
  case 9:
    if ((byte *)(ptr + 2) == end_00) {
      return -0xf;
    }
  case 10:
  case 0x15:
    while (pbVar6 = (byte *)ptr, ptr = (char *)(pbVar6 + 2), (byte *)ptr != end_00) {
      bVar1 = *ptr;
      if (bVar1 < 0xdc) {
        cVar2 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            cVar2 = *(char *)((long)enc[1].scanners + (ulong)pbVar6[3]);
          }
          else {
LAB_0015d6ac:
            cVar2 = '\x1d';
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        cVar2 = '\b';
      }
      else {
        if ((bVar1 != 0xff) || (pbVar6[3] < 0xfe)) goto LAB_0015d6ac;
        cVar2 = '\0';
      }
      if (((cVar2 != '\x15') && (cVar2 != '\n')) && ((cVar2 != '\t' || (pbVar6 + 4 == end_00))))
      break;
    }
    *nextTokPtr = ptr;
    iVar3 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x11;
    break;
  case 0xc:
    iVar3 = 0xc;
    goto LAB_0015d6de;
  case 0xd:
    iVar3 = 0xd;
LAB_0015d6de:
    iVar3 = big2_scanLit(iVar3,enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar3;
  case 0x13:
    iVar3 = big2_scanPoundName(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar3;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_0015d254_caseD_16;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
    iVar3 = 0x13;
    goto switchD_0015d254_caseD_16;
  case 0x1d:
    bVar7 = ptr[1];
    if (((*(uint *)((long)namingBitmap +
                   (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] * 0x20 + (uint)(bVar7 >> 5) * 4))
          >> (bVar7 & 0x1f) & 1) != 0) ||
       (iVar3 = 0x13,
       (*(uint *)((long)namingBitmap +
                 (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] * 0x20 + (uint)(bVar7 >> 5) * 4
                        )) & 1 << (bVar7 & 0x1f)) != 0)) goto switchD_0015d254_caseD_16;
switchD_0015d254_caseD_3:
    *nextTokPtr = ptr;
LAB_0015d499:
    iVar3 = 0;
    break;
  case 0x1e:
    iVar3 = big2_scanPercent(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar3;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x17;
    break;
  case 0x20:
    pbVar6 = (byte *)(ptr + 2);
    if (pbVar6 == end_00) {
      return -0x18;
    }
    bVar1 = *pbVar6;
    if (bVar1 < 0xdc) {
      bVar7 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar7 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        }
        else {
LAB_0015d7cf:
          bVar7 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar7 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto LAB_0015d7cf;
      bVar7 = 0;
    }
    if (bVar7 < 0x20) {
      if (2 < bVar7 - 9) {
        if (bVar7 == 0xf) {
          *nextTokPtr = ptr + 4;
          return 0x23;
        }
        if (bVar7 != 0x15) goto switchD_0015d80e_default;
      }
switchD_0015d80e_caseD_20:
      *nextTokPtr = (char *)pbVar6;
      iVar3 = 0x18;
    }
    else {
      switch(bVar7) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_0015d80e_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 4;
        iVar3 = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 4;
        iVar3 = 0x25;
        break;
      default:
switchD_0015d80e_default:
        *nextTokPtr = (char *)pbVar6;
        goto LAB_0015d499;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x15;
  }
  return iVar3;
switchD_0015d254_caseD_16:
  pbVar6 = (byte *)(ptr + 2);
joined_r0x0015d263:
  ptr = (char *)pbVar6;
  if ((byte *)ptr == end_00) {
    return -iVar3;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    uVar4 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
      }
      else {
LAB_0015d2d0:
        uVar4 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar4 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_0015d2d0;
    uVar4 = 0;
  }
  switch(uVar4) {
  case 5:
    goto switchD_0015d254_caseD_5;
  case 6:
    goto switchD_0015d254_caseD_6;
  case 7:
    goto switchD_0015d254_caseD_7;
  default:
    goto switchD_0015d254_caseD_3;
  case 9:
  case 10:
  case 0xb:
  case 0x14:
  case 0x15:
  case 0x1e:
  case 0x20:
  case 0x23:
  case 0x24:
    *nextTokPtr = ptr;
    return iVar3;
  case 0xf:
    if (iVar3 != 0x13) {
      *nextTokPtr = (char *)((byte *)ptr + 2);
      return 0x1e;
    }
    goto switchD_0015d254_caseD_3;
  case 0x17:
    break;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(((byte *)ptr)[1] >> 3 & 0x1c |
                         (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
         (((byte *)ptr)[1] & 0x1f) & 1) == 0) goto switchD_0015d254_caseD_3;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    pbVar6 = (byte *)ptr + 2;
    goto joined_r0x0015d263;
  case 0x21:
    if (iVar3 != 0x13) {
      *nextTokPtr = (char *)((byte *)ptr + 2);
      return 0x1f;
    }
    goto switchD_0015d254_caseD_3;
  case 0x22:
    if (iVar3 != 0x13) {
      *nextTokPtr = (char *)((byte *)ptr + 2);
      return 0x20;
    }
    goto switchD_0015d254_caseD_3;
  }
  pbVar6 = (byte *)ptr + 2;
  if (iVar3 == 0x29) {
    iVar3 = 0x13;
  }
  else if (iVar3 == 0x12) {
    if (pbVar6 == end_00) {
      return -1;
    }
    bVar1 = *pbVar6;
    if (bVar1 < 0xdc) {
      bVar7 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar7 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
        }
        else {
LAB_0015d3a6:
          bVar7 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar7 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (((byte *)ptr)[3] < 0xfe)) goto LAB_0015d3a6;
      bVar7 = 0;
    }
    iVar3 = 0x13;
    if (0x17 < bVar7) {
      if (3 < bVar7 - 0x18) {
        if (bVar7 != 0x1d) goto joined_r0x0015d263;
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(((byte *)ptr)[3] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             (((byte *)ptr)[3] & 0x1f) & 1) == 0) goto LAB_0015d908;
      }
LAB_0015d3c2:
      iVar3 = 0x29;
      pbVar6 = (byte *)ptr + 4;
      goto joined_r0x0015d263;
    }
    if (bVar7 < 0x16) {
      if (bVar7 == 5) {
        if ((long)end_00 - (long)pbVar6 < 2) {
          return -2;
        }
      }
      else {
        if (bVar7 != 6) goto code_r0x0015d42b;
        if ((long)end_00 - (long)pbVar6 < 3) {
          return -2;
        }
      }
      goto LAB_0015d908;
    }
    if (bVar7 == 0x16) goto LAB_0015d3c2;
  }
  goto joined_r0x0015d263;
code_r0x0015d42b:
  if (bVar7 == 7) goto code_r0x0015d435;
  goto joined_r0x0015d263;
code_r0x0015d435:
  if ((long)end_00 - (long)pbVar6 < 4) {
    return -2;
  }
LAB_0015d908:
  *nextTokPtr = (char *)pbVar6;
  goto LAB_0015d499;
}

Assistant:

static
int PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                      const char **nextTokPtr)
{
  int tok;
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end)
      return -XML_TOK_PROLOG_S;
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (ptr == end)
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        if (ptr == end)
          return XML_TOK_PARTIAL;
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}